

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string parquetOutFile_00;
  bool ord_output;
  bool all_idx;
  bool remove_zero_exposure_records;
  bool skipheader;
  int iVar1;
  undefined7 uVar2;
  bool bVar3;
  undefined1 in_stack_ffffffffffffff28 [16];
  undefined4 uVar4;
  undefined4 uVar5;
  string parquetOutFile;
  string local_90;
  string local_70;
  string local_50 [32];
  
  parquetOutFile._M_dataplus._M_p = (pointer)&parquetOutFile.field_2;
  parquetOutFile._M_string_length = 0;
  parquetOutFile.field_2._M_local_buf[0] = '\0';
  skipheader = false;
  uVar4 = 0;
  uVar5 = 0;
  remove_zero_exposure_records = false;
  ord_output = false;
  bVar3 = false;
  all_idx = false;
  do {
    iVar1 = getopt(argc,argv,"zvhfseoap:");
    switch(iVar1) {
    case 0x6f:
      ord_output = true;
      break;
    case 0x70:
      bVar3 = true;
      std::__cxx11::string::assign((char *)&parquetOutFile);
      break;
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x78:
    case 0x79:
      break;
    case 0x73:
      skipheader = true;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
LAB_00101a90:
      exit(1);
    case 0x7a:
      remove_zero_exposure_records = true;
      break;
    default:
      uVar2 = (undefined7)
              ((ulong)((long)&switchD_00101944::switchdataD_00102008 +
                      (long)(int)(&switchD_00101944::switchdataD_00102008)[iVar1 - 0x61]) >> 8);
      switch(iVar1) {
      case 0x61:
        all_idx = true;
        break;
      case 0x62:
      case 99:
      case 100:
      case 0x67:
        break;
      case 0x65:
        uVar5 = (undefined4)CONCAT71(uVar2,1);
        break;
      case 0x66:
        uVar4 = (undefined4)CONCAT71(uVar2,1);
        break;
      case 0x68:
        help();
        goto LAB_00101a90;
      default:
        if (iVar1 == -1) {
          if (!bVar3) {
            std::__cxx11::string::string
                      ((string *)&local_70,"",(allocator *)&stack0xffffffffffffff37);
            std::__cxx11::string::string
                      ((string *)&local_90,"",(allocator *)&stack0xffffffffffffff36);
            initstreams(&local_70,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::string(local_50,(string *)&parquetOutFile);
            parquetOutFile_00._8_16_ = in_stack_ffffffffffffff28;
            parquetOutFile_00._M_dataplus._M_p = (pointer)local_50;
            parquetOutFile_00.field_2._8_4_ = uVar4;
            parquetOutFile_00.field_2._12_4_ = uVar5;
            doit(skipheader,(bool)((byte)uVar4 & 1),(bool)((byte)uVar5 & 1),
                 remove_zero_exposure_records,ord_output,all_idx,false,parquetOutFile_00);
            std::__cxx11::string::~string(local_50);
            std::__cxx11::string::~string((string *)&parquetOutFile);
            return 0;
          }
          fwrite("FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
                 ,0x79,1,_stderr);
          goto LAB_00101a90;
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	bool skipheader = false;
	bool fullprecision = false;
	bool show_exposure_value = false;
	bool remove_zero_exposure_records = false;
	bool ord_output = false;   // csv output
	bool parquet_output = false;   // parquet output
	std::string parquetOutFile;   // parquet output
	bool all_idx = false;
	while ((opt = getopt(argc, argv, "zvhfseoap:")) != -1) {
		switch (opt) {
		case 's':
			skipheader = true;
			break;
		case 'f':
			fullprecision = true;
			break;
		case 'e':
			show_exposure_value = true;
			break;
		case 'z':
			remove_zero_exposure_records = true;
			break;
		case 'o':
			ord_output = true;
			break;
		case 'p':
			parquet_output = true;
			parquetOutFile = optarg;
			break;
		case 'a':
			all_idx = true;
			break;
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquet_output) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

	initstreams();
	doit(skipheader, fullprecision, show_exposure_value,
	     remove_zero_exposure_records, ord_output, all_idx, parquet_output,
	     parquetOutFile);
	return EXIT_SUCCESS;
}